

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_waitable_timer.hpp
# Opt level: O0

size_t __thiscall
asio::
basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
::expires_after(basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                *this,duration *expiry_time)

{
  service_type *this_00;
  implementation_type *impl;
  size_t sVar1;
  size_t s;
  error_code ec;
  duration *expiry_time_local;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *this_local;
  
  ec._M_cat = (error_category *)expiry_time;
  std::error_code::error_code((error_code *)&s);
  this_00 = detail::
            io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
            ::get_service(&this->impl_);
  impl = detail::
         io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
         ::get_implementation(&this->impl_);
  sVar1 = detail::
          deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::expires_after(this_00,impl,(duration_type *)ec._M_cat,(error_code *)&s);
  detail::throw_error((error_code *)&s,"expires_after");
  return sVar1;
}

Assistant:

std::size_t expires_after(const duration& expiry_time)
  {
    asio::error_code ec;
    std::size_t s = impl_.get_service().expires_after(
        impl_.get_implementation(), expiry_time, ec);
    asio::detail::throw_error(ec, "expires_after");
    return s;
  }